

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O2

void __thiscall
re2::Prog::EmitList(Prog *this,int root,SparseArray<int> *rootmap,
                   vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *flat,
                   SparseSet *reachable,vector<int,_std::allocator<int>_> *stk)

{
  Inst *this_00;
  pointer piVar1;
  pointer pIVar2;
  bool bVar3;
  int *piVar4;
  int iVar5;
  uint uVar6;
  uint local_4c;
  SparseArray<int> *local_48;
  int local_3c;
  vector<int,_std::allocator<int>_> *local_38;
  
  reachable->size_ = 0;
  piVar1 = (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
      != piVar1) {
    (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish =
         piVar1;
  }
  local_4c = root;
  local_48 = rootmap;
  local_38 = stk;
  std::vector<int,_std::allocator<int>_>::push_back(stk,(value_type_conflict *)&local_4c);
LAB_001f385c:
  do {
    piVar1 = (local_38->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if ((local_38->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_start == piVar1) {
      return;
    }
    uVar6 = piVar1[-1];
    (local_38->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = piVar1 + -1;
    while( true ) {
      bVar3 = SparseSetT<void>::contains(reachable,uVar6);
      if (bVar3) break;
      SparseSetT<void>::insert_new(reachable,uVar6);
      if (uVar6 != local_4c) {
        bVar3 = SparseArray<int>::has_index(local_48,uVar6);
        if (bVar3) {
          std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::emplace_back<>(flat);
          pIVar2 = (flat->super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
          pIVar2[-1].out_opcode_ = pIVar2[-1].out_opcode_ & 0xfffffff8 | 6;
          piVar4 = SparseArray<int>::get_existing(local_48,uVar6);
          pIVar2[-1].out_opcode_ = pIVar2[-1].out_opcode_ & 0xf | *piVar4 << 4;
          break;
        }
      }
      this_00 = (this->inst_).ptr_._M_t.
                super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>._M_t
                .super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
                super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl + (int)uVar6;
      uVar6 = this_00->out_opcode_;
      switch(uVar6 & 7) {
      case 1:
        std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::emplace_back<>(flat);
        pIVar2 = (flat->super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
        iVar5 = (int)((ulong)((long)pIVar2 -
                             (long)(flat->
                                   super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>
                                   )._M_impl.super__Vector_impl_data._M_start) >> 3);
        pIVar2[-1].out_opcode_ = (pIVar2[-1].out_opcode_ & 8) + iVar5 * 0x10 + 1;
        pIVar2[-1].field_1.out1_ = iVar5 + 1;
      case 0:
        local_3c = Inst::out1(this_00);
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(local_38,&local_3c);
        uVar6 = this_00->out_opcode_;
      case 6:
        uVar6 = uVar6 >> 4;
        break;
      default:
        std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::emplace_back<>(flat);
        (flat->super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>)._M_impl.
        super__Vector_impl_data._M_finish[-1] = *this_00;
        pIVar2 = (flat->super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
        piVar4 = SparseArray<int>::get_existing(local_48,this_00->out_opcode_ >> 4);
        pIVar2[-1].out_opcode_ = pIVar2[-1].out_opcode_ & 0xf | *piVar4 << 4;
        goto LAB_001f385c;
      case 5:
      case 7:
        std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::emplace_back<>(flat);
        (flat->super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>)._M_impl.
        super__Vector_impl_data._M_finish[-1] = *this_00;
        goto LAB_001f385c;
      }
    }
  } while( true );
}

Assistant:

void Prog::EmitList(int root, SparseArray<int>* rootmap,
                    std::vector<Inst>* flat,
                    SparseSet* reachable, std::vector<int>* stk) {
  reachable->clear();
  stk->clear();
  stk->push_back(root);
  while (!stk->empty()) {
    int id = stk->back();
    stk->pop_back();
  Loop:
    if (reachable->contains(id))
      continue;
    reachable->insert_new(id);

    if (id != root && rootmap->has_index(id)) {
      // We reached another "tree" via epsilon transition. Emit a kInstNop
      // instruction so that the Prog does not become quadratically larger.
      flat->emplace_back();
      flat->back().set_opcode(kInstNop);
      flat->back().set_out(rootmap->get_existing(id));
      continue;
    }

    Inst* ip = inst(id);
    switch (ip->opcode()) {
      default:
        LOG(DFATAL) << "unhandled opcode: " << ip->opcode();
        break;

      case kInstAltMatch:
        flat->emplace_back();
        flat->back().set_opcode(kInstAltMatch);
        flat->back().set_out(static_cast<int>(flat->size()));
        flat->back().out1_ = static_cast<uint32_t>(flat->size())+1;
        FALLTHROUGH_INTENDED;

      case kInstAlt:
        stk->push_back(ip->out1());
        id = ip->out();
        goto Loop;

      case kInstByteRange:
      case kInstCapture:
      case kInstEmptyWidth:
        flat->emplace_back();
        memmove(&flat->back(), ip, sizeof *ip);
        flat->back().set_out(rootmap->get_existing(ip->out()));
        break;

      case kInstNop:
        id = ip->out();
        goto Loop;

      case kInstMatch:
      case kInstFail:
        flat->emplace_back();
        memmove(&flat->back(), ip, sizeof *ip);
        break;
    }
  }
}